

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O1

void __thiscall
cmTargetSourcesCommand::HandleImportedTarget(cmTargetSourcesCommand *this,string *tgt)

{
  cmMakefile *this_00;
  ostream *poVar1;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Cannot specify sources for imported target \"",0x2c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(tgt->_M_dataplus)._M_p,tgt->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
  this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmTargetSourcesCommand
::HandleImportedTarget(const std::string &tgt)
{
  std::ostringstream e;
  e << "Cannot specify sources for imported target \""
    << tgt << "\".";
  this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
}